

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

int64_t GetPredictionCostCrossColorRed
                  (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                  VP8LMultipliers prev_y,int green_to_red,uint32_t *accumulated_red_histo)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int64_t cur_diff;
  uint32_t histo [256];
  uint32_t *in_stack_fffffffffffffbc8;
  uint32_t *in_stack_fffffffffffffbd0;
  uint32_t local_428 [259];
  int local_1c;
  int local_18;
  int local_14;
  uint32_t *local_10;
  undefined2 local_6;
  undefined1 local_4;
  undefined2 local_3;
  undefined1 local_1;
  
  local_3 = (undefined2)in_R8D;
  local_1 = (undefined1)((uint)in_R8D >> 0x10);
  local_4 = (undefined1)((uint)in_R9D >> 0x10);
  local_6 = (undefined2)in_R9D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_428,0,0x400);
  (*VP8LCollectColorRedTransforms)(local_10,local_14,local_18,local_1c,(uint)cur_diff,local_428);
  lVar1 = PredictionCostCrossColor(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  if (((uint)cur_diff & 0xff) == (uint)(byte)local_3) {
    lVar1 = lVar1 + -0x1800000;
  }
  if (((uint)cur_diff & 0xff) == (uint)(byte)local_6) {
    lVar1 = lVar1 + -0x1800000;
  }
  if ((uint)cur_diff == 0) {
    lVar1 = lVar1 + -0x1800000;
  }
  return lVar1;
}

Assistant:

static int64_t GetPredictionCostCrossColorRed(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y, int green_to_red,
    const uint32_t accumulated_red_histo[256]) {
  uint32_t histo[256] = { 0 };
  int64_t cur_diff;

  VP8LCollectColorRedTransforms(argb, stride, tile_width, tile_height,
                                green_to_red, histo);

  cur_diff = PredictionCostCrossColor(accumulated_red_histo, histo);
  if ((uint8_t)green_to_red == prev_x.green_to_red) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)green_to_red == prev_y.green_to_red) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if (green_to_red == 0) {
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  return cur_diff;
}